

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_resetDStream(ZSTD_DStream *dctx)

{
  uint uVar1;
  size_t err_code;
  ZSTD_DStream *dctx_local;
  
  dctx_local = (ZSTD_DStream *)ZSTD_DCtx_reset(dctx,ZSTD_reset_session_only);
  uVar1 = ERR_isError((size_t)dctx_local);
  if (uVar1 == 0) {
    dctx_local = (ZSTD_DStream *)ZSTD_startingInputLength(dctx->format);
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_resetDStream(ZSTD_DStream* dctx)
{
    DEBUGLOG(4, "ZSTD_resetDStream");
    FORWARD_IF_ERROR(ZSTD_DCtx_reset(dctx, ZSTD_reset_session_only), "");
    return ZSTD_startingInputLength(dctx->format);
}